

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cpp
# Opt level: O2

json json_read_safe(json *j,string *key,string *default_to)

{
  bool bVar1;
  reference other;
  ostream *poVar2;
  undefined4 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  json_value extraout_RDX;
  json jVar4;
  value_type data_item;
  
  other = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)key,default_to);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&data_item,other);
  bVar1 = nlohmann::operator==<std::nullptr_t,_0>(&data_item,(void *)0x0);
  if (bVar1) {
    bVar1 = std::operator==(in_RCX,"0");
    if (bVar1) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0x16;
      __cxa_throw(puVar3,&int::typeinfo,0);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Key: ");
    poVar2 = std::operator<<(poVar2,(string *)default_to);
    poVar2 = std::operator<<(poVar2," not found. Defaulting to: ");
    poVar2 = std::operator<<(poVar2,(string *)in_RCX);
    poVar2 = std::operator<<(poVar2," method");
    std::endl<char,std::char_traits<char>>(poVar2);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (j,in_RCX);
  }
  else {
    j->m_type = data_item.m_type;
    j->m_value = data_item.m_value;
    data_item.m_type = null;
    data_item.m_value.object = (object_t *)0x0;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&data_item);
  jVar4.m_value.object = extraout_RDX.object;
  jVar4._0_8_ = j;
  return jVar4;
}

Assistant:

json json_read_safe(json j, string key, string default_to){

    try {
        auto data_item = j[key];

        if(data_item==nullptr) {
            if(default_to=="0") throw 22;
            cout<<"Key: "<<key<< " not found. Defaulting to: "<<default_to<<" method"<<endl;
            return default_to;
        }

        return data_item;
    }
    catch (int e)
    {
        // output exception information
        cout<<"Error. Key '"<<key<<"' does not exist!"<<endl;
        exit(23);
    }

}